

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_type(fb_parser_t *P,fb_value_t *v)

{
  ulong uVar1;
  long lVar2;
  unsigned_short uVar3;
  fb_token_t *pfVar4;
  fb_token_t *pfVar5;
  fb_token_t *pfVar6;
  char *pcVar7;
  int iVar8;
  anon_union_16_9_a0fedaf0_for_fb_value_0 local_48;
  short local_38;
  
  pfVar6 = P->token;
  v->len = 1;
  v->type = 1;
  iVar8 = 1;
  do {
    pfVar4 = optional(P,0x5b);
    iVar8 = iVar8 + -1;
  } while (pfVar4 != (fb_token_t *)0x0);
  if (1 < (uint)-iVar8) {
    error_tok(P,pfVar6,"vector type can only be one-dimensional");
  }
  pfVar4 = P->token;
  lVar2 = pfVar4->id;
  uVar1 = lVar2 + 999;
  if (uVar1 < 0x1e) {
    if ((0x25fb4ff7UL >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 != 0x1b) goto LAB_0011bd10;
      (v->field_0).t = pfVar4;
      uVar3 = (iVar8 == 0) + 10;
    }
    else {
      (v->field_0).t = pfVar4;
      uVar3 = (iVar8 == 0) + 8;
    }
    v->type = uVar3;
    next(P);
  }
  else {
LAB_0011bd10:
    if (lVar2 == 9) {
      parse_ref(P,(fb_ref_t **)v);
      v->type = (iVar8 == 0) + 0xc;
    }
    else {
      if (lVar2 == 0x5d) {
        pcVar7 = "vector type cannot be empty";
        pfVar5 = (fb_token_t *)0x0;
      }
      else {
        pcVar7 = "invalid type specifier";
        pfVar5 = pfVar4;
      }
      error_tok(P,pfVar5,pcVar7);
    }
  }
  if ((iVar8 == 0) || (pfVar5 = optional(P,0x3a), pfVar5 == (fb_token_t *)0x0)) goto LAB_0011bdbe;
  pfVar5 = P->token;
  parse_value(P,(fb_value_t *)&local_48.s,0,
              "fixed length array length expected to be an unsigned integer");
  if (local_38 != 6) {
    error_tok(P,pfVar5,"fixed length array length expected to be an unsigned integer");
    v->type = 1;
    goto LAB_0011bdbe;
  }
  uVar3 = v->type;
  if (uVar3 == 1) goto LAB_0011bdbe;
  if (uVar3 == 8) {
    uVar3 = 0x11;
LAB_0011bd34:
    v->type = uVar3;
    if (local_48.s.s == (char *)0x0) {
      pcVar7 = "fixed length array length cannot be 0";
    }
    else {
      if (local_48.u >> 0x20 == 0) {
        v->len = (uint32_t)local_48.i;
        goto LAB_0011bdbe;
      }
      pcVar7 = "fixed length array length overflow";
    }
  }
  else {
    if (uVar3 == 10) {
      uVar3 = 0x13;
      goto LAB_0011bd34;
    }
    if (uVar3 == 0xc) {
      uVar3 = 0x12;
      goto LAB_0011bd34;
    }
    pcVar7 = "invalid fixed length array type";
    pfVar5 = pfVar4;
  }
  error_tok(P,pfVar5,pcVar7);
  v->type = 1;
LAB_0011bdbe:
  do {
    pfVar5 = optional(P,0x5d);
    if (pfVar5 == (fb_token_t *)0x0) {
      if (iVar8 == 0) goto LAB_0011bdf2;
      break;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1);
  error_tok_2(P,(fb_token_t *)0x0,"vector type missing \']\' to match",pfVar6);
LAB_0011bdf2:
  pfVar5 = optional(P,0x5d);
  if (pfVar5 != (fb_token_t *)0x0) {
    error_tok_2(P,pfVar5,"extra \']\' not matching",pfVar6);
    do {
      pfVar6 = optional(P,0x5d);
    } while (pfVar6 != (fb_token_t *)0x0);
  }
  if ((pfVar4->id == -0x3e5) && ((v->type | 0x10) != 0x11)) {
    error_tok(P,pfVar4,"char can only be used as a fixed length array type [char:<n>]");
    v->type = 1;
  }
  return;
}

Assistant:

static void parse_type(fb_parser_t *P, fb_value_t *v)
{
    fb_token_t *t = 0;
    fb_token_t *ttype = 0;
    fb_token_t *t0 = P->token;
    int vector = 0;

    v->len = 1;
    v->type = vt_invalid;
    while ((t = optional(P, '['))) {
        ++vector;
    }
    if (vector > 1) {
        error_tok(P, t0, "vector type can only be one-dimensional");
    }
    ttype = P->token;
    switch (ttype->id) {
    case tok_kw_int:
    case tok_kw_bool:
    case tok_kw_byte:
    case tok_kw_long:
    case tok_kw_uint:
    case tok_kw_float:
    case tok_kw_short:
    case tok_kw_char:
    case tok_kw_ubyte:
    case tok_kw_ulong:
    case tok_kw_ushort:
    case tok_kw_double:
    case tok_kw_int8:
    case tok_kw_int16:
    case tok_kw_int32:
    case tok_kw_int64:
    case tok_kw_uint8:
    case tok_kw_uint16:
    case tok_kw_uint32:
    case tok_kw_uint64:
    case tok_kw_float32:
    case tok_kw_float64:
        v->t = P->token;
        v->type = vector ? vt_vector_type : vt_scalar_type;
        next(P);
        break;
    case tok_kw_string:
        v->t = P->token;
        v->type = vector ? vt_vector_string_type : vt_string_type;
        next(P);
        break;
    case LEX_TOK_ID:
        parse_ref(P, &v->ref);
        v->type = vector ? vt_vector_type_ref : vt_type_ref;
        break;
    case ']':
        error_tok(P, t, "vector type cannot be empty");
        break;
    default:
        error_tok(P, ttype, "invalid type specifier");
        break;
    }
    if (vector && optional(P, ':')) {
        parse_fixed_array_size(P, ttype, v);
    }
    while (optional(P, ']') && vector--) {
    }
    if (vector) {
        error_tok_2(P, t, "vector type missing ']' to match", t0);
    }
    if ((t = optional(P, ']'))) {
        error_tok_2(P, t, "extra ']' not matching", t0);
        while (optional(P, ']')) {
        }
    }
    if (ttype->id == tok_kw_char && v->type != vt_invalid) {
        if (v->type != vt_fixed_array_type) {
            error_tok(P, ttype, "char can only be used as a fixed length array type [char:<n>]");
            v->type = vt_invalid;
        }
    }
}